

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O2

void __thiscall tst_helpers_map::convertValues(tst_helpers_map *this)

{
  QSharedData *pQVar1;
  PromiseData<QString> *this_00;
  long lVar2;
  undefined **ppuVar3;
  initializer_list<int> args;
  initializer_list<QString> args_00;
  PromiseResolver<QString> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_150;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_148;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_140;
  Data *local_138;
  QArrayDataPointer<QString> local_130;
  Data *local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data> local_110;
  QArrayDataPointer<QString> local_108;
  QArrayDataPointer<QString> local_e8;
  QString *local_d0;
  long local_c8;
  long local_c0;
  PromiseType p;
  vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_> promises;
  QString local_90;
  QString local_78;
  int local_54 [3];
  QArrayDataPointer<char16_t> local_48;
  
  local_54[0] = 0x2a;
  local_54[1] = 0x2b;
  local_54[2] = 0x2c;
  args._M_len = 3;
  args._M_array = local_54;
  QList<int>::QList((QList<int> *)&local_e8,args);
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promises.
  super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = local_e8.ptr;
  local_c8 = local_e8.size << 2;
  ppuVar3 = &PTR__QPromiseBase_00127ac8;
  local_118 = (Data *)&PTR__QPromiseBase_00127a80;
  local_138 = (Data *)&PTR__QPromiseBase_00127ac8;
  for (lVar2 = 0; local_c8 != lVar2; lVar2 = lVar2 + 4) {
    local_130.d = (Data *)ppuVar3;
    this_00 = (PromiseData<QString> *)operator_new(0x68);
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_error.m_data.
    _M_exception_object = (void *)0x0;
    (this_00->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.size = 0;
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.size = 0;
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_catchers.d.d = (Data *)0x0;
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.d = (Data *)0x0;
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_lock = 0;
    *(undefined8 *)&(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).m_settled = 0;
    (this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)
     &(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData = 0;
    (this_00->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<QString>::PromiseData(this_00);
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (this_00 != (PromiseData<QString> *)0x0) {
      LOCK();
      pQVar1 = &(this_00->super_PromiseDataBase<QString,_void_(const_QString_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_108.d = local_118;
    local_130.ptr = (QString *)this_00;
    local_108.ptr = (QString *)this_00;
    QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
              (&resolver,(QPromise<QString> *)&local_108);
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_108);
    ppuVar3 = (undefined **)local_138;
    if (resolver.m_d.d == (Data *)0x0) {
      local_140.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_140 = resolver.m_d.d;
    }
    local_148.d = (Data *)0x0;
    if (local_140.d == (Data *)0x0) {
      local_110.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_140.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_110.d = local_140.d;
    }
    local_150.d = (Data *)0x0;
    local_c0 = lVar2;
    QString::number((int)&local_48,*(int *)((long)&(local_d0->d).d + lVar2) + 1);
    QtPromisePrivate::PromiseResolver<QString>::resolve<QString>
              ((PromiseResolver<QString> *)&local_140,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_110);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_150);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_140);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&local_148);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QString>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    local_130.d = local_118;
    std::vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>>::
    emplace_back<QtPromise::QPromise<QString>>
              ((vector<QtPromise::QPromise<QString>,std::allocator<QtPromise::QPromise<QString>>> *)
               &promises,(QPromise<QString> *)&local_130);
    lVar2 = local_c0;
    QtPromise::QPromiseBase<QString>::~QPromiseBase((QPromiseBase<QString> *)&local_130);
  }
  QtPromise::all<QString,_std::vector,_std::allocator<QtPromise::QPromise<QString>_>_>
            ((QtPromise *)&p,&promises);
  std::vector<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>::~vector
            (&promises);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_e8);
  local_108.d = (Data *)0x0;
  local_108.ptr = (QString *)0x0;
  local_108.size = 0;
  waitForValue<QList<QString>>((QList<QString> *)&local_e8,&p,(QList<QString> *)&local_108);
  QString::QString((QString *)&promises,"43");
  QString::QString(&local_90,"44");
  QString::QString(&local_78,"45");
  args_00._M_len = 3;
  args_00._M_array = (iterator)&promises;
  QList<QString>::QList((QList<QString> *)&local_130,args_00);
  QTest::qCompare<QString>
            ((QList<QString> *)&local_e8,(QList<QString> *)&local_130,
             "waitForValue(p, QVector<QString>{})","(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_map.cpp"
             ,0x4d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_130);
  lVar2 = 0x30;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               ((long)&promises.
                       super__Vector_base<QtPromise::QPromise<QString>,_std::allocator<QtPromise::QPromise<QString>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase(&p.super_QPromiseBase<QList<QString>_>);
  return;
}

Assistant:

void tst_helpers_map::convertValues()
{
    auto p = QtPromise::map(QVector<int>{42, 43, 44}, [](int v, ...) {
        return QString::number(v + 1);
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<QString>>>::value));
    QCOMPARE(waitForValue(p, QVector<QString>{}), (QVector<QString>{"43", "44", "45"}));
}